

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O0

void os_initialize(void)

{
  if (os_initialize::initialized == 0) {
    os_initialize::initialized = 1;
    ERR_load_ERR_strings();
    OPENSSL_init_crypto(2,0);
    OPENSSL_init_crypto(0xc,0);
  }
  return;
}

Assistant:

void os_initialize() {
	static int initialized = 0;
	if (initialized == 0) {
		initialized = 1;
		ERR_load_ERR_strings();
		ERR_load_crypto_strings();
		OpenSSL_add_all_algorithms();
	}
}